

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O3

uint32_t FAudioCreateReverb(FAPO **ppApo,uint32_t Flags)

{
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  undefined4 in_register_00000034;
  FAudioFXReverbParameters fxdefault;
  
  fxdefault.ReflectionsGain = 0.0;
  fxdefault.ReverbGain = 0.0;
  fxdefault.DecayTime = 1.0;
  fxdefault.Density = 100.0;
  fxdefault.LowEQGain = '\b';
  fxdefault.LowEQCutoff = '\x04';
  fxdefault.HighEQGain = '\b';
  fxdefault.HighEQCutoff = '\x04';
  fxdefault.RoomFilterFreq = 5000.0;
  fxdefault.RoomFilterMain = 0.0;
  fxdefault.RoomFilterHF = 0.0;
  fxdefault.WetDryMix = 100.0;
  fxdefault.ReflectionsDelay = 5;
  fxdefault.ReverbDelay = '\x05';
  fxdefault.RearDelay = '\x05';
  fxdefault.PositionLeft = '\x06';
  fxdefault.PositionRight = '\x06';
  fxdefault.PositionMatrixLeft = '\x1b';
  fxdefault.PositionMatrixRight = '\x1b';
  fxdefault.EarlyDiffusion = '\b';
  fxdefault.LateDiffusion = '\b';
  fxdefault.RoomSize = 100.0;
  fapo = (FAPOBase *)SDL_malloc(0x18d0,CONCAT44(in_register_00000034,Flags));
  pParameterBlocks = (uint8_t *)SDL_malloc(0x9c);
  *(undefined1 *)((long)&fapo[1].base.Release + 4) = 7;
  SDL_memcpy(pParameterBlocks,&fxdefault,0x34);
  SDL_memcpy(pParameterBlocks + 0x34,&fxdefault,0x34);
  SDL_memcpy(pParameterBlocks + 0x68,&fxdefault,0x34);
  SDL_memcpy(&ReverbProperties,&FAudioFX_CLSID_AudioReverb,0x10);
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,&ReverbProperties,pParameterBlocks,0x34,'\0',SDL_malloc,SDL_free,SDL_realloc);
  fapo[1].base.AddRef = (AddRefFunc)0x0;
  SDL_memset(&fapo[1].base.GetRegistrationProperties,0,0x17e0);
  (fapo->base).LockForProcess = FAudioFXReverb_LockForProcess;
  (fapo->base).IsInputFormatSupported = FAudioFXReverb_IsInputFormatSupported;
  (fapo->base).IsOutputFormatSupported = FAudioFXReverb_IsOutputFormatSupported;
  (fapo->base).Initialize = FAudioFXReverb_Initialize;
  (fapo->base).Reset = FAudioFXReverb_Reset;
  (fapo->base).Process = FAudioFXReverb_Process;
  fapo->Destructor = FAudioFXReverb_Free;
  *ppApo = (FAPO *)fapo;
  return 0;
}

Assistant:

uint32_t FAudioCreateReverb(FAPO** ppApo, uint32_t Flags)
{
	return FAudioCreateReverbWithCustomAllocatorEXT(
		ppApo,
		Flags,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}